

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<8,_1,_false,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMiIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float **ppfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  RTCIntersectArguments *pRVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [32];
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  byte bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  StackItemT<embree::NodeRefPtr<8>_> *pSVar24;
  uint uVar25;
  long lVar26;
  ulong uVar27;
  byte bVar28;
  byte bVar29;
  ulong uVar30;
  uint uVar31;
  size_t sVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  bool bVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar39 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  float fVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [64];
  undefined4 uVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar72 [64];
  undefined1 auVar73 [16];
  uint uVar74;
  uint uVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  long lStack_2610;
  int local_25ec;
  ulong local_25e8;
  RayHit *local_25e0;
  long local_25d8;
  RayQueryContext *local_25d0;
  Geometry *local_25c8;
  Scene *local_25c0;
  StackItemT<embree::NodeRefPtr<8>_> *local_25b8;
  long local_25b0;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  float local_2548;
  undefined8 local_2528;
  undefined8 uStack_2520;
  undefined1 local_2518 [16];
  undefined1 local_2508 [16];
  undefined1 local_24f8 [16];
  undefined1 local_24e8 [16];
  byte local_24d7;
  float local_24c8 [4];
  float local_24b8 [4];
  undefined1 local_24a8 [16];
  undefined1 local_2498 [16];
  undefined1 local_2488 [16];
  undefined1 local_2478 [16];
  undefined8 local_2468;
  undefined8 uStack_2460;
  undefined1 local_2458 [32];
  undefined1 local_2438 [32];
  undefined1 local_2418 [32];
  undefined1 local_23f8 [32];
  undefined1 local_23d8 [32];
  undefined1 local_23b8 [32];
  undefined1 local_2398 [32];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  
  stack[0].ptr.ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack[0].ptr.ptr != 8) {
    local_25b8 = stack + 1;
    stack[0].dist = 0;
    aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar39 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar51 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar37._8_4_ = 0x7fffffff;
    auVar37._0_8_ = 0x7fffffff7fffffff;
    auVar37._12_4_ = 0x7fffffff;
    auVar37 = vandps_avx512vl((undefined1  [16])aVar2,auVar37);
    auVar49._8_4_ = 0x219392ef;
    auVar49._0_8_ = 0x219392ef219392ef;
    auVar49._12_4_ = 0x219392ef;
    uVar30 = vcmpps_avx512vl(auVar37,auVar49,1);
    bVar36 = (bool)((byte)uVar30 & 1);
    auVar50._0_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * (int)aVar2.x;
    bVar36 = (bool)((byte)(uVar30 >> 1) & 1);
    auVar50._4_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * (int)aVar2.y;
    bVar36 = (bool)((byte)(uVar30 >> 2) & 1);
    auVar50._8_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * (int)aVar2.z;
    bVar36 = (bool)((byte)(uVar30 >> 3) & 1);
    auVar50._12_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * aVar2.field_3.a;
    auVar37 = vrcp14ps_avx512vl(auVar50);
    auVar38._8_4_ = 0x3f800000;
    auVar38._0_8_ = 0x3f8000003f800000;
    auVar38._12_4_ = 0x3f800000;
    auVar38 = vfnmadd213ps_avx512vl(auVar50,auVar37,auVar38);
    auVar50 = vfmadd132ps_fma(auVar38,auVar37,auVar37);
    auVar54 = vbroadcastss_avx512vl(auVar50);
    auVar77 = ZEXT3264(auVar54);
    auVar37 = vmovshdup_avx(auVar50);
    auVar54 = vbroadcastsd_avx512vl(auVar37);
    auVar78 = ZEXT3264(auVar54);
    auVar38 = vshufpd_avx(auVar50,auVar50,1);
    auVar58._8_4_ = 2;
    auVar58._0_8_ = 0x200000002;
    auVar58._12_4_ = 2;
    auVar58._16_4_ = 2;
    auVar58._20_4_ = 2;
    auVar58._24_4_ = 2;
    auVar58._28_4_ = 2;
    auVar54 = vpermps_avx512vl(auVar58,ZEXT1632(auVar50));
    auVar79 = ZEXT3264(auVar54);
    fVar64 = auVar50._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar59._4_4_ = fVar64;
    auVar59._0_4_ = fVar64;
    auVar59._8_4_ = fVar64;
    auVar59._12_4_ = fVar64;
    auVar59._16_4_ = fVar64;
    auVar59._20_4_ = fVar64;
    auVar59._24_4_ = fVar64;
    auVar59._28_4_ = fVar64;
    auVar54 = vbroadcastss_avx512vl(ZEXT416(1));
    auVar80 = ZEXT3264(auVar54);
    auVar56 = ZEXT1632(CONCAT412(auVar50._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                 CONCAT48(auVar50._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2],
                                          CONCAT44(auVar50._4_4_ *
                                                   (ray->super_RayK<1>).org.field_0.m128[1],fVar64))
                                ));
    auVar55 = vpermps_avx512vl(auVar54,auVar56);
    auVar54 = vpermps_avx2(auVar58,auVar56);
    local_25e8 = (ulong)(auVar50._0_4_ < 0.0) << 5;
    uVar30 = (ulong)(auVar37._0_4_ < 0.0) << 5 | 0x40;
    uVar35 = (ulong)(auVar38._0_4_ < 0.0) << 5 | 0x80;
    uVar34 = local_25e8 ^ 0x20;
    uVar68 = auVar51._0_4_;
    auVar67 = ZEXT3264(CONCAT428(uVar68,CONCAT424(uVar68,CONCAT420(uVar68,CONCAT416(uVar68,CONCAT412
                                                  (uVar68,CONCAT48(uVar68,CONCAT44(uVar68,uVar68))))
                                                  ))));
    auVar57._8_4_ = 0x80000000;
    auVar57._0_8_ = 0x8000000080000000;
    auVar57._12_4_ = 0x80000000;
    auVar57._16_4_ = 0x80000000;
    auVar57._20_4_ = 0x80000000;
    auVar57._24_4_ = 0x80000000;
    auVar57._28_4_ = 0x80000000;
    auVar56 = vxorps_avx512vl(auVar59,auVar57);
    auVar81 = ZEXT3264(auVar56);
    auVar55 = vxorps_avx512vl(auVar55,auVar57);
    auVar82 = ZEXT3264(auVar55);
    auVar54 = vxorps_avx512vl(auVar54,auVar57);
    auVar83 = ZEXT3264(auVar54);
    auVar54 = vbroadcastss_avx512vl(auVar39);
    auVar84 = ZEXT3264(auVar54);
    auVar54 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar85 = ZEXT3264(auVar54);
    auVar54 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar86 = ZEXT3264(auVar54);
    auVar39 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
    auVar87 = ZEXT1664(auVar39);
    auVar54 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
    auVar88 = ZEXT3264(auVar54);
    local_25d0 = context;
    local_25e0 = ray;
LAB_01c58107:
    if (local_25b8 != stack) {
      pSVar24 = local_25b8 + -1;
      local_25b8 = local_25b8 + -1;
      if ((float)pSVar24->dist <= (local_25e0->super_RayK<1>).tfar) {
        sVar32 = (local_25b8->ptr).ptr;
LAB_01c5812d:
        do {
          if ((sVar32 & 8) != 0) goto LAB_01c5848b;
          auVar54 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(sVar32 + 0x40 + local_25e8),auVar81._0_32_,
                               auVar77._0_32_);
          auVar55 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(sVar32 + 0x40 + uVar30),auVar82._0_32_,
                               auVar78._0_32_);
          auVar54 = vpmaxsd_avx2(auVar54,auVar55);
          auVar55 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(sVar32 + 0x40 + uVar35),auVar83._0_32_,
                               auVar79._0_32_);
          auVar55 = vpmaxsd_avx512vl(auVar55,auVar84._0_32_);
          auVar54 = vpmaxsd_avx2(auVar54,auVar55);
          auVar55 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(sVar32 + 0x40 + uVar34),auVar81._0_32_,
                               auVar77._0_32_);
          auVar56 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(sVar32 + 0x40 + (uVar30 ^ 0x20)),
                               auVar82._0_32_,auVar78._0_32_);
          auVar55 = vpminsd_avx2(auVar55,auVar56);
          auVar56 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(sVar32 + 0x40 + (uVar35 ^ 0x20)),
                               auVar83._0_32_,auVar79._0_32_);
          auVar56 = vpminsd_avx2(auVar56,auVar67._0_32_);
          auVar55 = vpminsd_avx2(auVar55,auVar56);
          uVar33 = vpcmpd_avx512vl(auVar54,auVar55,2);
          bVar28 = (byte)uVar33;
          if (bVar28 == 0) break;
          auVar55 = *(undefined1 (*) [32])(sVar32 & 0xfffffffffffffff0);
          auVar56 = ((undefined1 (*) [32])(sVar32 & 0xfffffffffffffff0))[1];
          auVar57 = vmovdqa64_avx512vl(auVar85._0_32_);
          auVar57 = vpternlogd_avx512vl(auVar57,auVar54,auVar86._0_32_,0xf8);
          auVar58 = vpcompressd_avx512vl(auVar57);
          auVar61._0_4_ =
               (uint)(bVar28 & 1) * auVar58._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar57._0_4_;
          bVar36 = (bool)((byte)(uVar33 >> 1) & 1);
          auVar61._4_4_ = (uint)bVar36 * auVar58._4_4_ | (uint)!bVar36 * auVar57._4_4_;
          bVar36 = (bool)((byte)(uVar33 >> 2) & 1);
          auVar61._8_4_ = (uint)bVar36 * auVar58._8_4_ | (uint)!bVar36 * auVar57._8_4_;
          bVar36 = (bool)((byte)(uVar33 >> 3) & 1);
          auVar61._12_4_ = (uint)bVar36 * auVar58._12_4_ | (uint)!bVar36 * auVar57._12_4_;
          bVar36 = (bool)((byte)(uVar33 >> 4) & 1);
          auVar61._16_4_ = (uint)bVar36 * auVar58._16_4_ | (uint)!bVar36 * auVar57._16_4_;
          bVar36 = (bool)((byte)(uVar33 >> 5) & 1);
          auVar61._20_4_ = (uint)bVar36 * auVar58._20_4_ | (uint)!bVar36 * auVar57._20_4_;
          bVar36 = (bool)((byte)(uVar33 >> 6) & 1);
          auVar61._24_4_ = (uint)bVar36 * auVar58._24_4_ | (uint)!bVar36 * auVar57._24_4_;
          bVar36 = SUB81(uVar33 >> 7,0);
          auVar61._28_4_ = (uint)bVar36 * auVar58._28_4_ | (uint)!bVar36 * auVar57._28_4_;
          auVar57 = vpermt2q_avx512vl(auVar55,auVar61,auVar56);
          sVar32 = auVar57._0_8_;
          bVar28 = bVar28 - 1 & bVar28;
          if (bVar28 != 0) {
            auVar57 = vpshufd_avx2(auVar61,0x55);
            vpermt2q_avx512vl(auVar55,auVar57,auVar56);
            auVar58 = vpminsd_avx2(auVar61,auVar57);
            auVar57 = vpmaxsd_avx2(auVar61,auVar57);
            bVar28 = bVar28 - 1 & bVar28;
            if (bVar28 == 0) {
              auVar58 = vpermi2q_avx512vl(auVar58,auVar55,auVar56);
              sVar32 = auVar58._0_8_;
              auVar55 = vpermt2q_avx512vl(auVar55,auVar57,auVar56);
              (local_25b8->ptr).ptr = auVar55._0_8_;
              lVar26 = 8;
              lStack_2610 = 0x10;
            }
            else {
              auVar16 = vpshufd_avx2(auVar61,0xaa);
              vpermt2q_avx512vl(auVar55,auVar16,auVar56);
              auVar59 = vpminsd_avx2(auVar58,auVar16);
              auVar58 = vpmaxsd_avx2(auVar58,auVar16);
              auVar16 = vpminsd_avx2(auVar57,auVar58);
              auVar58 = vpmaxsd_avx2(auVar57,auVar58);
              bVar28 = bVar28 - 1 & bVar28;
              if (bVar28 == 0) {
                auVar57 = vpermi2q_avx512vl(auVar59,auVar55,auVar56);
                sVar32 = auVar57._0_8_;
                auVar57 = vpermt2q_avx512vl(auVar55,auVar58,auVar56);
                (local_25b8->ptr).ptr = auVar57._0_8_;
                auVar57 = vpermd_avx2(auVar58,auVar54);
                local_25b8->dist = auVar57._0_4_;
                auVar55 = vpermt2q_avx512vl(auVar55,auVar16,auVar56);
                local_25b8[1].ptr.ptr = auVar55._0_8_;
                lStack_2610 = 0x18;
                lVar26 = lStack_2610;
                lStack_2610 = 0x20;
                auVar57 = auVar16;
              }
              else {
                auVar57 = vpshufd_avx2(auVar61,0xff);
                vpermt2q_avx512vl(auVar55,auVar57,auVar56);
                auVar63 = vpminsd_avx2(auVar59,auVar57);
                auVar59 = vpmaxsd_avx2(auVar59,auVar57);
                auVar57 = vpminsd_avx2(auVar16,auVar59);
                auVar59 = vpmaxsd_avx2(auVar16,auVar59);
                auVar16 = vpminsd_avx2(auVar58,auVar59);
                auVar58 = vpmaxsd_avx2(auVar58,auVar59);
                bVar28 = bVar28 - 1 & bVar28;
                if (bVar28 != 0) {
                  auVar60 = valignd_avx512vl(auVar61,auVar61,3);
                  auVar61 = vmovdqa64_avx512vl(auVar87._0_32_);
                  auVar59 = vmovdqa64_avx512vl(auVar87._0_32_);
                  auVar62 = vmovdqa64_avx512vl(auVar88._0_32_);
                  auVar63 = vpermt2d_avx512vl(auVar59,auVar88._0_32_,auVar63);
                  auVar59 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                  auVar57 = vpermt2d_avx512vl(auVar63,auVar59,auVar57);
                  auVar59 = vpermt2d_avx512vl(auVar57,auVar59,auVar16);
                  auVar57 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                  auVar57 = vpermt2d_avx512vl(auVar59,auVar57,auVar58);
                  auVar87 = ZEXT3264(auVar57);
                  bVar29 = bVar28;
                  do {
                    auVar58 = auVar87._0_32_;
                    auVar57 = vpermps_avx512vl(auVar80._0_32_,auVar60);
                    auVar60 = valignd_avx512vl(auVar60,auVar60,1);
                    vpermt2q_avx512vl(auVar55,auVar60,auVar56);
                    bVar29 = bVar29 - 1 & bVar29;
                    uVar20 = vpcmpd_avx512vl(auVar57,auVar58,5);
                    auVar57 = vpmaxsd_avx2(auVar57,auVar58);
                    bVar21 = (byte)uVar20 << 1;
                    auVar58 = valignd_avx512vl(auVar58,auVar58,7);
                    bVar36 = (bool)((byte)uVar20 & 1);
                    bVar11 = (bool)(bVar21 >> 2 & 1);
                    bVar12 = (bool)(bVar21 >> 3 & 1);
                    bVar13 = (bool)(bVar21 >> 4 & 1);
                    bVar14 = (bool)(bVar21 >> 5 & 1);
                    bVar15 = (bool)(bVar21 >> 6 & 1);
                    auVar87 = ZEXT3264(CONCAT428((uint)(bVar21 >> 7) * auVar58._28_4_ |
                                                 (uint)!(bool)(bVar21 >> 7) * auVar57._28_4_,
                                                 CONCAT424((uint)bVar15 * auVar58._24_4_ |
                                                           (uint)!bVar15 * auVar57._24_4_,
                                                           CONCAT420((uint)bVar14 * auVar58._20_4_ |
                                                                     (uint)!bVar14 * auVar57._20_4_,
                                                                     CONCAT416((uint)bVar13 *
                                                                               auVar58._16_4_ |
                                                                               (uint)!bVar13 *
                                                                               auVar57._16_4_,
                                                                               CONCAT412((uint)
                                                  bVar12 * auVar58._12_4_ |
                                                  (uint)!bVar12 * auVar57._12_4_,
                                                  CONCAT48((uint)bVar11 * auVar58._8_4_ |
                                                           (uint)!bVar11 * auVar57._8_4_,
                                                           CONCAT44((uint)bVar36 * auVar58._4_4_ |
                                                                    (uint)!bVar36 * auVar57._4_4_,
                                                                    auVar57._0_4_))))))));
                  } while (bVar29 != 0);
                  lVar26 = (ulong)(uint)POPCOUNT((uint)bVar28) + 3;
                  while( true ) {
                    auVar58 = auVar87._0_32_;
                    auVar57 = vpermt2q_avx512vl(auVar55,auVar58,auVar56);
                    sVar32 = auVar57._0_8_;
                    bVar36 = lVar26 == 0;
                    lVar26 = lVar26 + -1;
                    if (bVar36) break;
                    (local_25b8->ptr).ptr = sVar32;
                    auVar57 = vpermd_avx2(auVar58,auVar54);
                    local_25b8->dist = auVar57._0_4_;
                    auVar57 = valignd_avx512vl(auVar58,auVar58,1);
                    auVar87 = ZEXT3264(auVar57);
                    local_25b8 = local_25b8 + 1;
                  }
                  auVar54 = vmovdqa64_avx512vl(auVar61);
                  auVar87 = ZEXT3264(auVar54);
                  auVar54 = vmovdqa64_avx512vl(auVar62);
                  auVar88 = ZEXT3264(auVar54);
                  goto LAB_01c5812d;
                }
                auVar59 = vpermi2q_avx512vl(auVar63,auVar55,auVar56);
                sVar32 = auVar59._0_8_;
                auVar59 = vpermt2q_avx512vl(auVar55,auVar58,auVar56);
                (local_25b8->ptr).ptr = auVar59._0_8_;
                auVar58 = vpermd_avx2(auVar58,auVar54);
                local_25b8->dist = auVar58._0_4_;
                auVar58 = vpermt2q_avx512vl(auVar55,auVar16,auVar56);
                local_25b8[1].ptr.ptr = auVar58._0_8_;
                auVar58 = vpermd_avx2(auVar16,auVar54);
                local_25b8[1].dist = auVar58._0_4_;
                auVar55 = vpermt2q_avx512vl(auVar55,auVar57,auVar56);
                local_25b8[2].ptr.ptr = auVar55._0_8_;
                lVar26 = 0x28;
                lStack_2610 = 0x30;
              }
            }
            auVar54 = vpermd_avx2(auVar57,auVar54);
            *(int *)((long)&(local_25b8->ptr).ptr + lVar26) = auVar54._0_4_;
            local_25b8 = (StackItemT<embree::NodeRefPtr<8>_> *)
                         ((long)&(local_25b8->ptr).ptr + lStack_2610);
          }
        } while( true );
      }
      goto LAB_01c58107;
    }
  }
  return;
LAB_01c5848b:
  local_25b0 = (ulong)((uint)sVar32 & 0xf) - 8;
  uVar33 = sVar32 & 0xfffffffffffffff0;
  for (local_25d8 = 0; local_25d8 != local_25b0; local_25d8 = local_25d8 + 1) {
    lVar26 = local_25d8 * 0x50;
    ppfVar5 = (context->scene->vertices).items;
    pfVar6 = ppfVar5[*(uint *)(uVar33 + 0x30 + lVar26)];
    pfVar7 = ppfVar5[*(uint *)(uVar33 + 0x34 + lVar26)];
    pfVar8 = ppfVar5[*(uint *)(uVar33 + 0x38 + lVar26)];
    pfVar9 = ppfVar5[*(uint *)(uVar33 + 0x3c + lVar26)];
    auVar37 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar33 + lVar26)),
                            *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar33 + 8 + lVar26)));
    auVar39 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar33 + lVar26)),
                            *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar33 + 8 + lVar26)));
    auVar38 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar33 + 4 + lVar26)),
                            *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar33 + 0xc + lVar26)));
    auVar51 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar33 + 4 + lVar26)),
                            *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar33 + 0xc + lVar26)));
    auVar45 = vunpcklps_avx(auVar39,auVar51);
    auVar43 = vunpcklps_avx(auVar37,auVar38);
    auVar44 = vunpckhps_avx(auVar37,auVar38);
    auVar37 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar33 + 0x10 + lVar26)),
                            *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar33 + 0x18 + lVar26)));
    auVar39 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar33 + 0x10 + lVar26)),
                            *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar33 + 0x18 + lVar26)));
    auVar38 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar33 + 0x14 + lVar26)),
                            *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar33 + 0x1c + lVar26)));
    auVar51 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar33 + 0x14 + lVar26)),
                            *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar33 + 0x1c + lVar26)));
    auVar49 = vunpcklps_avx(auVar39,auVar51);
    auVar42 = vunpcklps_avx(auVar37,auVar38);
    auVar51 = vunpckhps_avx(auVar37,auVar38);
    auVar38 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar33 + 0x20 + lVar26)),
                            *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar33 + 0x28 + lVar26)));
    auVar39 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar33 + 0x20 + lVar26)),
                            *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar33 + 0x28 + lVar26)));
    auVar50 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar33 + 0x24 + lVar26)),
                            *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar33 + 0x2c + lVar26)));
    auVar37 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar33 + 0x24 + lVar26)),
                            *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar33 + 0x2c + lVar26)));
    auVar40 = vunpcklps_avx(auVar39,auVar37);
    auVar41 = vunpcklps_avx(auVar38,auVar50);
    puVar1 = (undefined8 *)(uVar33 + 0x30 + lVar26);
    local_2468 = *puVar1;
    uStack_2460 = puVar1[1];
    auVar50 = vunpckhps_avx(auVar38,auVar50);
    puVar1 = (undefined8 *)(uVar33 + 0x40 + lVar26);
    local_2528 = *puVar1;
    uStack_2520 = puVar1[1];
    auVar39 = vsubps_avx(auVar43,auVar42);
    auVar51 = vsubps_avx(auVar44,auVar51);
    auVar37 = vsubps_avx(auVar45,auVar49);
    auVar38 = vsubps_avx(auVar41,auVar43);
    auVar50 = vsubps_avx(auVar50,auVar44);
    auVar49 = vsubps_avx(auVar40,auVar45);
    auVar41._0_4_ = auVar51._0_4_ * auVar49._0_4_;
    auVar41._4_4_ = auVar51._4_4_ * auVar49._4_4_;
    auVar41._8_4_ = auVar51._8_4_ * auVar49._8_4_;
    auVar41._12_4_ = auVar51._12_4_ * auVar49._12_4_;
    local_2498 = vfmsub231ps_fma(auVar41,auVar50,auVar37);
    auVar46._0_4_ = auVar37._0_4_ * auVar38._0_4_;
    auVar46._4_4_ = auVar37._4_4_ * auVar38._4_4_;
    auVar46._8_4_ = auVar37._8_4_ * auVar38._8_4_;
    auVar46._12_4_ = auVar37._12_4_ * auVar38._12_4_;
    local_2488 = vfmsub231ps_fma(auVar46,auVar49,auVar39);
    auVar47._0_4_ = auVar39._0_4_ * auVar50._0_4_;
    auVar47._4_4_ = auVar39._4_4_ * auVar50._4_4_;
    auVar47._8_4_ = auVar39._8_4_ * auVar50._8_4_;
    auVar47._12_4_ = auVar39._12_4_ * auVar50._12_4_;
    uVar68 = *(undefined4 *)&(local_25e0->super_RayK<1>).dir.field_0;
    auVar76._4_4_ = uVar68;
    auVar76._0_4_ = uVar68;
    auVar76._8_4_ = uVar68;
    auVar76._12_4_ = uVar68;
    auVar40 = vbroadcastss_avx512vl(ZEXT416((uint)(local_25e0->super_RayK<1>).dir.field_0.m128[1]));
    auVar41 = vbroadcastss_avx512vl(ZEXT416((uint)(local_25e0->super_RayK<1>).dir.field_0.m128[2]));
    uVar68 = *(undefined4 *)&(local_25e0->super_RayK<1>).org.field_0;
    auVar42._4_4_ = uVar68;
    auVar42._0_4_ = uVar68;
    auVar42._8_4_ = uVar68;
    auVar42._12_4_ = uVar68;
    auVar42 = vsubps_avx512vl(auVar43,auVar42);
    local_2478 = vfmsub231ps_fma(auVar47,auVar38,auVar51);
    uVar68 = *(undefined4 *)((long)&(local_25e0->super_RayK<1>).org.field_0 + 4);
    auVar43._4_4_ = uVar68;
    auVar43._0_4_ = uVar68;
    auVar43._8_4_ = uVar68;
    auVar43._12_4_ = uVar68;
    auVar43 = vsubps_avx512vl(auVar44,auVar43);
    uVar68 = *(undefined4 *)((long)&(local_25e0->super_RayK<1>).org.field_0 + 8);
    auVar44._4_4_ = uVar68;
    auVar44._0_4_ = uVar68;
    auVar44._8_4_ = uVar68;
    auVar44._12_4_ = uVar68;
    auVar44 = vsubps_avx512vl(auVar45,auVar44);
    auVar45 = vmulps_avx512vl(auVar40,auVar44);
    auVar46 = vfmsub231ps_avx512vl(auVar45,auVar43,auVar41);
    auVar45 = vmulps_avx512vl(auVar41,auVar42);
    auVar47 = vfmsub231ps_avx512vl(auVar45,auVar44,auVar76);
    auVar45 = vmulps_avx512vl(auVar76,auVar43);
    auVar48 = vfmsub231ps_avx512vl(auVar45,auVar42,auVar40);
    auVar45 = vmulps_avx512vl(local_2478,auVar41);
    auVar45 = vfmadd231ps_avx512vl(auVar45,local_2488,auVar40);
    auVar41 = vfmadd231ps_avx512vl(auVar45,local_2498,auVar76);
    auVar45._8_4_ = 0x7fffffff;
    auVar45._0_8_ = 0x7fffffff7fffffff;
    auVar45._12_4_ = 0x7fffffff;
    local_24e8 = vandps_avx512vl(auVar41,auVar45);
    auVar49 = vmulps_avx512vl(auVar49,auVar48);
    auVar50 = vfmadd231ps_avx512vl(auVar49,auVar47,auVar50);
    auVar38 = vfmadd231ps_fma(auVar50,auVar46,auVar38);
    auVar40._8_4_ = 0x80000000;
    auVar40._0_8_ = 0x8000000080000000;
    auVar40._12_4_ = 0x80000000;
    auVar50 = vandpd_avx512vl(auVar41,auVar40);
    uVar25 = auVar50._0_4_;
    local_2518._0_4_ = (float)(uVar25 ^ auVar38._0_4_);
    uVar74 = auVar50._4_4_;
    local_2518._4_4_ = (float)(uVar74 ^ auVar38._4_4_);
    uVar31 = auVar50._8_4_;
    local_2518._8_4_ = (float)(uVar31 ^ auVar38._8_4_);
    uVar75 = auVar50._12_4_;
    local_2518._12_4_ = (float)(uVar75 ^ auVar38._12_4_);
    auVar37 = vmulps_avx512vl(auVar37,auVar48);
    auVar51 = vfmadd231ps_avx512vl(auVar37,auVar51,auVar47);
    auVar39 = vfmadd231ps_fma(auVar51,auVar39,auVar46);
    local_2508._0_4_ = (float)(uVar25 ^ auVar39._0_4_);
    local_2508._4_4_ = (float)(uVar74 ^ auVar39._4_4_);
    local_2508._8_4_ = (float)(uVar31 ^ auVar39._8_4_);
    local_2508._12_4_ = (float)(uVar75 ^ auVar39._12_4_);
    auVar39 = ZEXT816(0) << 0x20;
    uVar20 = vcmpps_avx512vl(local_2518,auVar39,5);
    uVar17 = vcmpps_avx512vl(local_2508,auVar39,5);
    uVar18 = vcmpps_avx512vl(auVar41,auVar39,4);
    auVar39._0_4_ = local_2518._0_4_ + local_2508._0_4_;
    auVar39._4_4_ = local_2518._4_4_ + local_2508._4_4_;
    auVar39._8_4_ = local_2518._8_4_ + local_2508._8_4_;
    auVar39._12_4_ = local_2518._12_4_ + local_2508._12_4_;
    uVar19 = vcmpps_avx512vl(auVar39,local_24e8,2);
    bVar28 = (byte)uVar20 & (byte)uVar17 & (byte)uVar18 & (byte)uVar19;
    if (bVar28 != 0) {
      auVar73._0_4_ = auVar44._0_4_ * local_2478._0_4_;
      auVar73._4_4_ = auVar44._4_4_ * local_2478._4_4_;
      auVar73._8_4_ = auVar44._8_4_ * local_2478._8_4_;
      auVar73._12_4_ = auVar44._12_4_ * local_2478._12_4_;
      auVar39 = vfmadd213ps_fma(auVar43,local_2488,auVar73);
      auVar39 = vfmadd213ps_fma(auVar42,local_2498,auVar39);
      local_24f8._0_4_ = (float)(uVar25 ^ auVar39._0_4_);
      local_24f8._4_4_ = (float)(uVar74 ^ auVar39._4_4_);
      local_24f8._8_4_ = (float)(uVar31 ^ auVar39._8_4_);
      local_24f8._12_4_ = (float)(uVar75 ^ auVar39._12_4_);
      uVar68 = *(undefined4 *)((long)&(local_25e0->super_RayK<1>).org.field_0 + 0xc);
      auVar51._4_4_ = uVar68;
      auVar51._0_4_ = uVar68;
      auVar51._8_4_ = uVar68;
      auVar51._12_4_ = uVar68;
      auVar39 = vmulps_avx512vl(local_24e8,auVar51);
      fVar64 = (local_25e0->super_RayK<1>).tfar;
      auVar48._4_4_ = fVar64;
      auVar48._0_4_ = fVar64;
      auVar48._8_4_ = fVar64;
      auVar48._12_4_ = fVar64;
      auVar51 = vmulps_avx512vl(local_24e8,auVar48);
      uVar20 = vcmpps_avx512vl(local_24f8,auVar51,2);
      uVar17 = vcmpps_avx512vl(auVar39,local_24f8,1);
      bVar28 = (byte)uVar20 & (byte)uVar17 & bVar28;
      if (bVar28 != 0) {
        local_25c0 = context->scene;
        auVar3._0_4_ = (local_25e0->super_RayK<1>).tfar;
        auVar3._4_4_ = (local_25e0->super_RayK<1>).mask;
        auVar3._8_4_ = (local_25e0->super_RayK<1>).id;
        auVar3._12_4_ = (local_25e0->super_RayK<1>).flags;
        auVar72 = ZEXT1664(auVar3);
        uVar25 = vextractps_avx(auVar3,1);
        local_24d7 = bVar28;
        auVar39 = vrcp14ps_avx512vl(local_24e8);
        auVar22._8_4_ = 0x3f800000;
        auVar22._0_8_ = 0x3f8000003f800000;
        auVar22._12_4_ = 0x3f800000;
        auVar51 = vfnmadd213ps_avx512vl(local_24e8,auVar39,auVar22);
        auVar39 = vfmadd132ps_fma(auVar51,auVar39,auVar39);
        fVar64 = auVar39._0_4_;
        local_24a8._0_4_ = fVar64 * local_24f8._0_4_;
        fVar69 = auVar39._4_4_;
        local_24a8._4_4_ = fVar69 * local_24f8._4_4_;
        fVar70 = auVar39._8_4_;
        local_24a8._8_4_ = fVar70 * local_24f8._8_4_;
        fVar71 = auVar39._12_4_;
        local_24a8._12_4_ = fVar71 * local_24f8._12_4_;
        auVar67 = ZEXT1664(local_24a8);
        local_24c8[0] = fVar64 * local_2518._0_4_;
        local_24c8[1] = fVar69 * local_2518._4_4_;
        local_24c8[2] = fVar70 * local_2518._8_4_;
        local_24c8[3] = fVar71 * local_2518._12_4_;
        local_24b8[0] = fVar64 * local_2508._0_4_;
        local_24b8[1] = fVar69 * local_2508._4_4_;
        local_24b8[2] = fVar70 * local_2508._8_4_;
        local_24b8[3] = fVar71 * local_2508._12_4_;
        auVar65._8_4_ = 0x7f800000;
        auVar65._0_8_ = 0x7f8000007f800000;
        auVar65._12_4_ = 0x7f800000;
        auVar39 = vblendmps_avx512vl(auVar65,local_24a8);
        auVar52._0_4_ = (uint)(bVar28 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar28 & 1) * 0x7f800000;
        bVar36 = (bool)(bVar28 >> 1 & 1);
        auVar52._4_4_ = (uint)bVar36 * auVar39._4_4_ | (uint)!bVar36 * 0x7f800000;
        bVar36 = (bool)(bVar28 >> 2 & 1);
        auVar52._8_4_ = (uint)bVar36 * auVar39._8_4_ | (uint)!bVar36 * 0x7f800000;
        bVar36 = (bool)(bVar28 >> 3 & 1);
        auVar52._12_4_ = (uint)bVar36 * auVar39._12_4_ | (uint)!bVar36 * 0x7f800000;
        auVar39 = vshufps_avx(auVar52,auVar52,0xb1);
        auVar39 = vminps_avx(auVar39,auVar52);
        auVar51 = vshufpd_avx(auVar39,auVar39,1);
        auVar39 = vminps_avx(auVar51,auVar39);
        uVar20 = vcmpps_avx512vl(auVar52,auVar39,0);
        bVar29 = (byte)uVar20 & bVar28;
        do {
          auVar39 = auVar67._0_16_;
          bVar21 = bVar28;
          if (bVar29 != 0) {
            bVar21 = bVar29;
          }
          uVar74 = 0;
          for (uVar31 = (uint)bVar21; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x80000000) {
            uVar74 = uVar74 + 1;
          }
          uVar31 = uVar74 & 0xff;
          h.geomID = *(uint *)((long)&local_2468 + (ulong)uVar31 * 4);
          local_25c8 = (local_25c0->geometries).items[h.geomID].ptr;
          if ((local_25c8->mask & uVar25) == 0) {
            bVar28 = ~(byte)(1 << (uVar74 & 0x1f)) & bVar28;
          }
          else {
            pRVar10 = local_25d0->args;
            local_2458 = auVar84._0_32_;
            local_2438 = auVar83._0_32_;
            local_2418 = auVar82._0_32_;
            local_23f8 = auVar81._0_32_;
            local_23d8 = auVar79._0_32_;
            local_23b8 = auVar78._0_32_;
            local_2398 = auVar77._0_32_;
            if (pRVar10->filter == (RTCFilterFunctionN)0x0) {
              args.context = local_25d0->user;
              if (local_25c8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                uVar27 = (ulong)(uVar31 << 2);
                fVar64 = *(float *)((long)local_24c8 + uVar27);
                fVar69 = *(float *)((long)local_24b8 + uVar27);
                (local_25e0->super_RayK<1>).tfar = *(float *)(local_24a8 + uVar27);
                (local_25e0->Ng).field_0.field_0.x = *(float *)(local_2498 + uVar27);
                (local_25e0->Ng).field_0.field_0.y = *(float *)(local_2488 + uVar27);
                (local_25e0->Ng).field_0.field_0.z = *(float *)(local_2478 + uVar27);
                local_25e0->u = fVar64;
                local_25e0->v = fVar69;
                local_25e0->primID = *(uint *)((long)&local_2528 + uVar27);
                local_25e0->geomID = h.geomID;
                local_25e0->instID[0] = (args.context)->instID[0];
                local_25e0->instPrimID[0] = (args.context)->instPrimID[0];
                break;
              }
            }
            else {
              args.context = local_25d0->user;
            }
            uVar27 = (ulong)(uVar31 * 4);
            h.Ng.field_0.field_0.x = *(float *)(local_2498 + uVar27);
            h.Ng.field_0.field_0.y = *(float *)(local_2488 + uVar27);
            h.Ng.field_0.field_0.z = *(float *)(local_2478 + uVar27);
            h.u = *(float *)((long)local_24c8 + uVar27);
            h.v = *(float *)((long)local_24b8 + uVar27);
            h.primID = *(uint *)((long)&local_2528 + uVar27);
            h.instID[0] = (args.context)->instID[0];
            h.instPrimID[0] = (args.context)->instPrimID[0];
            (local_25e0->super_RayK<1>).tfar = *(float *)(local_24a8 + uVar27);
            local_25ec = -1;
            args.valid = &local_25ec;
            args.geometryUserPtr = local_25c8->userPtr;
            args.ray = (RTCRayN *)local_25e0;
            args.hit = (RTCHitN *)&h;
            args.N = 1;
            if (local_25c8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01c58a90:
              if ((pRVar10->filter != (RTCFilterFunctionN)0x0) &&
                 (((pRVar10->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((local_25c8->field_8).field_0x2 & 0x40) != 0))
                 )) {
                (*pRVar10->filter)(&args);
                if (*args.valid == 0) goto LAB_01c58b1f;
              }
              *(undefined4 *)(args.ray + 0x30) = *(undefined4 *)args.hit;
              *(undefined4 *)(args.ray + 0x34) = *(undefined4 *)(args.hit + 4);
              *(undefined4 *)(args.ray + 0x38) = *(undefined4 *)(args.hit + 8);
              *(undefined4 *)(args.ray + 0x3c) = *(undefined4 *)(args.hit + 0xc);
              *(undefined4 *)(args.ray + 0x40) = *(undefined4 *)(args.hit + 0x10);
              *(undefined4 *)(args.ray + 0x44) = *(undefined4 *)(args.hit + 0x14);
              *(undefined4 *)(args.ray + 0x48) = *(undefined4 *)(args.hit + 0x18);
              *(undefined4 *)(args.ray + 0x4c) = *(undefined4 *)(args.hit + 0x1c);
              *(undefined4 *)(args.ray + 0x50) = *(undefined4 *)(args.hit + 0x20);
            }
            else {
              (*local_25c8->intersectionFilterN)(&args);
              if (*args.valid != 0) goto LAB_01c58a90;
LAB_01c58b1f:
              local_2548 = auVar72._0_4_;
              (local_25e0->super_RayK<1>).tfar = local_2548;
            }
            auVar4._0_4_ = (local_25e0->super_RayK<1>).tfar;
            auVar4._4_4_ = (local_25e0->super_RayK<1>).mask;
            auVar4._8_4_ = (local_25e0->super_RayK<1>).id;
            auVar4._12_4_ = (local_25e0->super_RayK<1>).flags;
            auVar72 = ZEXT1664(auVar4);
            auVar67 = ZEXT1664(auVar39);
            fVar64 = (local_25e0->super_RayK<1>).tfar;
            auVar23._4_4_ = fVar64;
            auVar23._0_4_ = fVar64;
            auVar23._8_4_ = fVar64;
            auVar23._12_4_ = fVar64;
            uVar20 = vcmpps_avx512vl(auVar39,auVar23,2);
            bVar28 = ~(byte)(1 << (uVar74 & 0x1f)) & bVar28 & (byte)uVar20;
            uVar25 = vextractps_avx(auVar4,1);
            auVar77 = ZEXT3264(local_2398);
            auVar78 = ZEXT3264(local_23b8);
            auVar79 = ZEXT3264(local_23d8);
            auVar54 = vbroadcastss_avx512vl(ZEXT416(1));
            auVar80 = ZEXT3264(auVar54);
            auVar81 = ZEXT3264(local_23f8);
            auVar82 = ZEXT3264(local_2418);
            auVar83 = ZEXT3264(local_2438);
            auVar84 = ZEXT3264(local_2458);
            auVar54 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
            auVar85 = ZEXT3264(auVar54);
            auVar54 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
            auVar86 = ZEXT3264(auVar54);
            auVar39 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
            auVar87 = ZEXT1664(auVar39);
            auVar54 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
            auVar88 = ZEXT3264(auVar54);
          }
          if (bVar28 == 0) break;
          auVar66._8_4_ = 0x7f800000;
          auVar66._0_8_ = 0x7f8000007f800000;
          auVar66._12_4_ = 0x7f800000;
          auVar39 = vblendmps_avx512vl(auVar66,auVar67._0_16_);
          auVar53._0_4_ =
               (uint)(bVar28 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar28 & 1) * 0x7f800000;
          bVar36 = (bool)(bVar28 >> 1 & 1);
          auVar53._4_4_ = (uint)bVar36 * auVar39._4_4_ | (uint)!bVar36 * 0x7f800000;
          bVar36 = (bool)(bVar28 >> 2 & 1);
          auVar53._8_4_ = (uint)bVar36 * auVar39._8_4_ | (uint)!bVar36 * 0x7f800000;
          bVar36 = (bool)(bVar28 >> 3 & 1);
          auVar53._12_4_ = (uint)bVar36 * auVar39._12_4_ | (uint)!bVar36 * 0x7f800000;
          auVar39 = vshufps_avx(auVar53,auVar53,0xb1);
          auVar39 = vminps_avx(auVar39,auVar53);
          auVar51 = vshufpd_avx(auVar39,auVar39,1);
          auVar39 = vminps_avx(auVar51,auVar39);
          uVar20 = vcmpps_avx512vl(auVar53,auVar39,0);
          bVar29 = (byte)uVar20 & bVar28;
        } while( true );
      }
    }
    context = local_25d0;
  }
  fVar64 = (local_25e0->super_RayK<1>).tfar;
  auVar67 = ZEXT3264(CONCAT428(fVar64,CONCAT424(fVar64,CONCAT420(fVar64,CONCAT416(fVar64,CONCAT412(
                                                  fVar64,CONCAT48(fVar64,CONCAT44(fVar64,fVar64)))))
                                               )));
  goto LAB_01c58107;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }